

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall SwitchTable::Action(SwitchTable *this,SymbolType *parent_type)

{
  compile_errcode cVar1;
  compile_errcode cVar2;
  SwitchChildStatement *this_00;
  
  this_00 = &this->m_switch_child_statement;
  cVar1 = SwitchChildStatement::Action(this_00,parent_type);
  cVar2 = cVar1;
  while (cVar2 == 0) {
    SwitchChildStatement::LogOutput(this_00);
    cVar2 = SwitchChildStatement::Action(this_00,parent_type);
  }
  return -(uint)(cVar1 != 0);
}

Assistant:

compile_errcode SwitchTable::Action(const SymbolType& parent_type) {
    int ret = 0;
    int count = 0;
    while (true) {
        if ((ret = m_switch_child_statement.Action(parent_type)) == COMPILE_OK) {
            m_switch_child_statement.LogOutput();
            count++;
        } else {
            break;
        }
    }
    if (count > 0)
        return COMPILE_OK;
    else
        return NOT_MATCH;
}